

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ExpressionBinder::QualifyColumnName
          (ExpressionBinder *this,ColumnRefExpression *col_ref,ErrorData *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  pointer pbVar1;
  bool bVar2;
  long lVar3;
  ErrorData *pEVar4;
  reference table_name;
  reference column_name;
  string *psVar5;
  ErrorData *in_RCX;
  pointer *__ptr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *base;
  string *column_name_00;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  qualified_col_ref_1;
  optional_ptr<duckdb::Binding,_true> binding;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  qualified_col_ref;
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  undefined1 local_b0 [72];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  bVar2 = ColumnRefExpression::IsQualified((ColumnRefExpression *)error);
  if (!bVar2) {
    (**(code **)(*(long *)error + 0x38))((string *)local_b0,error);
    LambdaRefExpression::FindMatchingBinding
              ((LambdaRefExpression *)this,
               (optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *)
               ((long)&(col_ref->super_ParsedExpression).super_BaseExpression.alias.field_2 + 8),
               (string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_);
    }
    if (this->_vptr_ExpressionBinder != (_func_int **)0x0) {
      return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             this;
    }
    this->_vptr_ExpressionBinder = (_func_int **)0x0;
  }
  lVar3 = (long)(*(long *)((long)&(error->final_message).field_2 + 8) -
                (error->final_message).field_2._M_allocated_capacity) >> 5;
  if (lVar3 == 2) {
    this_00 = &(error->final_message).field_2;
    local_c8._8_8_ =
         (col_ref->column_names).
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    table_name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)this_00,0);
    column_name = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)this_00,1);
    local_b8 = (undefined1  [8])
               Binder::GetMatchingBinding((Binder *)local_c8._8_8_,table_name,column_name,in_RCX);
    if (local_b8 == (undefined1  [8])0x0) {
      ErrorData::ErrorData((ErrorData *)local_b0);
      pEVar4 = (ErrorData *)
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)this_00,0);
      QualifyColumnName((ExpressionBinder *)local_d0,(string *)col_ref,pEVar4);
      if (local_d0 == (undefined1  [8])0x0) {
        CreateStructPack(this,col_ref);
      }
      else {
        local_c8._0_8_ = local_d0;
        local_d0 = (undefined1  [8])0x0;
        base = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&DAT_00000001;
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)this_00,1);
        CreateStructExtract(this,base,(string *)local_c8);
        if ((_func_int **)local_c8._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_c8._0_8_ + 8))();
        }
        local_c8._0_8_ = (pointer)0x0;
      }
      if (local_d0 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_d0 + 8))();
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_68);
      if ((vector<duckdb::DummyBinding,_true> *)local_b0._40_8_ !=
          (vector<duckdb::DummyBinding,_true> *)(local_b0 + 0x38)) {
        operator_delete((void *)local_b0._40_8_);
      }
      if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
        operator_delete((void *)local_b0._8_8_);
      }
    }
    else {
      pbVar1 = (col_ref->column_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      optional_ptr<duckdb::Binding,_true>::CheckValid
                ((optional_ptr<duckdb::Binding,_true> *)local_b8);
      column_name_00 = (string *)((long)local_b8 + 0x10);
      psVar5 = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)error);
      BindContext::CreateColumnReference
                ((BindContext *)this,(BindingAlias *)&pbVar1[4]._M_string_length,column_name_00,
                 (ColumnBindType)psVar5);
    }
  }
  else if (lVar3 == 1) {
    pEVar4 = (ErrorData *)
             ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)error);
    QualifyColumnName((ExpressionBinder *)local_b0,(string *)col_ref,pEVar4);
    if ((_func_int **)local_b0._0_8_ == (_func_int **)0x0) {
      CreateStructPack(this,col_ref);
    }
    else {
      this->_vptr_ExpressionBinder = (_func_int **)local_b0._0_8_;
      local_b0._0_8_ = (_func_int **)0x0;
    }
    if ((_func_int **)local_b0._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_b0._0_8_ + 8))();
    }
  }
  else {
    QualifyColumnNameWithManyDots(this,col_ref,error);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ExpressionBinder::QualifyColumnName(ColumnRefExpression &col_ref, ErrorData &error) {

	// try binding as a lambda parameter
	if (!col_ref.IsQualified()) {
		auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, col_ref.GetName());
		if (lambda_ref) {
			return lambda_ref;
		}
	}

	idx_t column_parts = col_ref.column_names.size();

	// column names can have an arbitrary amount of dots
	// here is how the resolution works:
	if (column_parts == 1) {
		// no dots (i.e. "part1")
		// -> part1 refers to a column
		// check if we can qualify the column name with the table name
		auto qualified_col_ref = QualifyColumnName(col_ref.GetColumnName(), error);
		if (qualified_col_ref) {
			// we could: return it
			return qualified_col_ref;
		}
		// we could not! Try creating an implicit struct_pack
		return CreateStructPack(col_ref);
	}

	if (column_parts == 2) {
		// one dot (i.e. "part1.part2")
		// EITHER:
		// -> part1 is a table, part2 is a column
		// -> part1 is a column, part2 is a property of that column (i.e. struct_extract)

		// first check if part1 is a table, and part2 is a standard column name
		auto binding = binder.GetMatchingBinding(col_ref.column_names[0], col_ref.column_names[1], error);
		if (binding) {
			// it is! return the column reference directly
			return binder.bind_context.CreateColumnReference(binding->alias, col_ref.GetColumnName());
		}

		// otherwise check if we can turn this into a struct extract
		ErrorData other_error;
		auto qualified_col_ref = QualifyColumnName(col_ref.column_names[0], other_error);
		if (qualified_col_ref) {
			// we could: create a struct extract
			return CreateStructExtract(std::move(qualified_col_ref), col_ref.column_names[1]);
		}
		// we could not! Try creating an implicit struct_pack
		return CreateStructPack(col_ref);
	}

	// three or more dots
	return QualifyColumnNameWithManyDots(col_ref, error);
}